

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O0

void make_glx_context_current_or_skip(Display *dpy)

{
  XVisualInfo *visinfo_00;
  Window WVar1;
  long lVar2;
  Window win;
  XVisualInfo *visinfo;
  GLXContext ctx;
  Display *dpy_local;
  
  visinfo_00 = get_glx_visual(dpy);
  WVar1 = get_glx_window(dpy,visinfo_00,false);
  lVar2 = (*_epoxy_glXCreateContext)(dpy,visinfo_00,0,1);
  if (lVar2 == 0) {
    fprintf(_stderr,"glXCreateContext failed\n");
    exit(1);
  }
  (*_epoxy_glXMakeCurrent)(dpy,WVar1,lVar2);
  return;
}

Assistant:

void
make_glx_context_current_or_skip(Display *dpy)
{
	GLXContext ctx;
	XVisualInfo *visinfo = get_glx_visual(dpy);
	Window win = get_glx_window(dpy, visinfo, false);

	ctx = glXCreateContext(dpy, visinfo, False, True);
	if (ctx == None) {
		fprintf(stderr, "glXCreateContext failed\n");
		exit(1);
	}

	glXMakeCurrent(dpy, win, ctx);
}